

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t *
container_from_run_range(run_container_t *run,uint32_t min,uint32_t max,uint8_t *typecode_after)

{
  int iVar1;
  array_container_t *paVar2;
  array_container_t *array;
  uint32_t rle_max;
  uint32_t rle_min;
  int32_t i;
  int32_t union_cardinality;
  bitset_container_t *bitset;
  uint8_t *typecode_after_local;
  uint32_t max_local;
  uint32_t min_local;
  run_container_t *run_local;
  
  run_local = (run_container_t *)bitset_container_create();
  *typecode_after = '\x01';
  rle_min = 0;
  for (rle_max = 0; (int)rle_max < run->n_runs; rle_max = rle_max + 1) {
    bitset_set_lenrange((uint64_t *)run_local->runs,(uint)run->runs[(int)rle_max].value,
                        (uint)run->runs[(int)rle_max].length);
    rle_min = run->runs[(int)rle_max].length + 1 + rle_min;
  }
  iVar1 = bitset_lenrange_cardinality((uint64_t *)run_local->runs,min,max - min);
  bitset_set_lenrange((uint64_t *)run_local->runs,min,max - min);
  run_local->n_runs = ((max - min) + 1 + rle_min) - iVar1;
  if (run_local->n_runs < 0x1001) {
    paVar2 = array_container_from_bitset((bitset_container_t *)run_local);
    *typecode_after = '\x02';
    bitset_container_free((bitset_container_t *)run_local);
    run_local = (run_container_t *)paVar2;
  }
  return run_local;
}

Assistant:

container_t *container_from_run_range(
    const run_container_t *run,
    uint32_t min, uint32_t max, uint8_t *typecode_after
){
    // We expect most of the time to end up with a bitset container
    bitset_container_t *bitset = bitset_container_create();
    *typecode_after = BITSET_CONTAINER_TYPE;
    int32_t union_cardinality = 0;
    for (int32_t i = 0; i < run->n_runs; ++i) {
        uint32_t rle_min = run->runs[i].value;
        uint32_t rle_max = rle_min + run->runs[i].length;
        bitset_set_lenrange(bitset->words, rle_min, rle_max - rle_min);
        union_cardinality += run->runs[i].length + 1;
    }
    union_cardinality += max - min + 1;
    union_cardinality -= bitset_lenrange_cardinality(bitset->words, min, max-min);
    bitset_set_lenrange(bitset->words, min, max - min);
    bitset->cardinality = union_cardinality;
    if(bitset->cardinality <= DEFAULT_MAX_SIZE) {
        // we need to convert to an array container
        array_container_t * array = array_container_from_bitset(bitset);
        *typecode_after = ARRAY_CONTAINER_TYPE;
        bitset_container_free(bitset);
        return array;
    }
    return bitset;
}